

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::detail::IEEEFloat::initFromDoubleAPInt(IEEEFloat *this,APInt *api)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  
  if (api->BitWidth != 0x40) {
    __assert_fail("api.getBitWidth()==64",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc41,"void llvm::detail::IEEEFloat::initFromDoubleAPInt(const APInt &)");
  }
  uVar2 = (api->U).VAL;
  uVar4 = (uint)(uVar2 >> 0x34) & 0x7ff;
  uVar3 = uVar2 & 0xfffffffffffff;
  this->semantics = (fltSemantics *)semIEEEdouble;
  bVar1 = this->field_0x12;
  bVar5 = (byte)(uVar2 >> 0x3c) & 8;
  if (uVar4 == 0 && uVar3 == 0) {
    bVar5 = bVar1 & 0xf0 | bVar5 | 3;
  }
  else {
    if (uVar4 != 0x7ff || uVar3 != 0) {
      bVar5 = bVar1 & 0xf0 | bVar5;
      if (uVar3 != 0 && uVar4 == 0x7ff) {
        this->field_0x12 = bVar5 | 1;
        (this->significand).part = uVar3;
        return;
      }
      this->field_0x12 = bVar5 | 2;
      this->exponent = (short)uVar4 + -0x3ff;
      (this->significand).part = uVar3;
      if (uVar4 != 0) {
        (this->significand).parts = (integerPart *)(uVar3 + 0x10000000000000);
        return;
      }
      this->exponent = -0x3fe;
      return;
    }
    bVar5 = bVar1 & 0xf0 | bVar5;
  }
  this->field_0x12 = bVar5;
  return;
}

Assistant:

void IEEEFloat::initFromDoubleAPInt(const APInt &api) {
  assert(api.getBitWidth()==64);
  uint64_t i = *api.getRawData();
  uint64_t myexponent = (i >> 52) & 0x7ff;
  uint64_t mysignificand = i & 0xfffffffffffffLL;

  initialize(&semIEEEdouble);
  assert(partCount()==1);

  sign = static_cast<unsigned int>(i>>63);
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x7ff && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0x7ff && mysignificand!=0) {
    // exponent meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 1023;
    *significandParts() = mysignificand;
    if (myexponent==0)          // denormal
      exponent = -1022;
    else
      *significandParts() |= 0x10000000000000LL;  // integer bit
  }
}